

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:306:36)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:306:36)>
       *this,model *to)

{
  uint32_t uVar1;
  gc_heap *pgVar2;
  
  to->_vptr_model = (_func_int **)&PTR_destroy_001d3d58;
  pgVar2 = (this->f).prototype.super_gc_heap_ptr_untyped.heap_;
  to[1]._vptr_model = (_func_int **)pgVar2;
  *(uint32_t *)&to[2]._vptr_model = (this->f).prototype.super_gc_heap_ptr_untyped.pos_;
  if (pgVar2 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar2,(gc_heap_ptr_untyped *)(to + 1));
  }
  pgVar2 = (this->f).new_date.prototype.super_gc_heap_ptr_untyped.heap_;
  uVar1 = (this->f).new_date.prototype.super_gc_heap_ptr_untyped.pos_;
  to[3]._vptr_model = (_func_int **)pgVar2;
  *(uint32_t *)&to[4]._vptr_model = uVar1;
  if (pgVar2 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar2,(gc_heap_ptr_untyped *)(to + 3));
  }
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }